

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O0

int32 logmath_write(logmath_t *lmath,char *file_name)

{
  int32 iVar1;
  long lVar2;
  size_t align;
  ulong uStack_30;
  uint32 chksum;
  long pos;
  FILE *fp;
  char *file_name_local;
  logmath_t *lmath_local;
  
  fp = (FILE *)file_name;
  file_name_local = (char *)lmath;
  if ((lmath->t).table == (void *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0x118,"No log table to write!\n");
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0x11c,"Writing log table file \'%s\'\n");
    pos = (long)fopen((char *)fp,"wb");
    if ((FILE *)pos == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                     ,0x11e,"Failed to open logtable file \'%s\' for writing",fp);
    }
    else {
      fprintf((FILE *)pos,"s3\nversion 1.0\nchksum0 yes\n");
      fprintf((FILE *)pos,"width %d\n",(ulong)(byte)file_name_local[0xc]);
      fprintf((FILE *)pos,"shift %d\n",(ulong)(uint)(int)file_name_local[0xd]);
      fprintf((FILE *)pos,"logbase %f\n",*(undefined8 *)(file_name_local + 0x20));
      lVar2 = ftell((FILE *)pos);
      uStack_30 = lVar2 + 7;
      if ((uStack_30 & (ulong)(byte)file_name_local[0xc] - 1) != 0) {
        if (8 < (byte)file_name_local[0xc]) {
          __assert_fail("lmath->t.width <= 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                        ,300,"int32 logmath_write(logmath_t *, const char *)");
        }
        fwrite("        ",1,
               (ulong)(byte)file_name_local[0xc] -
               (uStack_30 & (ulong)(byte)file_name_local[0xc] - 1),(FILE *)pos);
      }
      fprintf((FILE *)pos,"endhdr\n");
      align._4_4_ = 0x11223344;
      fwrite((void *)((long)&align + 4),4,1,(FILE *)pos);
      align._4_4_ = 0;
      iVar1 = bio_fwrite(file_name_local + 8,4,1,(FILE *)pos,0,(uint32 *)((long)&align + 4));
      if (iVar1 == 1) {
        iVar1 = bio_fwrite(*(void **)file_name_local,(uint)(byte)file_name_local[0xc],
                           *(int32 *)(file_name_local + 8),(FILE *)pos,0,
                           (uint32 *)((long)&align + 4));
        if (iVar1 == *(int *)(file_name_local + 8)) {
          iVar1 = bio_fwrite((void *)((long)&align + 4),4,1,(FILE *)pos,0,(uint32 *)0x0);
          if (iVar1 == 1) {
            fclose((FILE *)pos);
            return 0;
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                  ,0x143,"Failed to write checksum to the file \'%s\'",fp);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                  ,0x13f,"Failed to write data (%d x %d bytes) to the file \'%s\'",
                  (ulong)*(uint *)(file_name_local + 8),(ulong)(byte)file_name_local[0xc],fp);
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                ,0x138,"Failed to write data to a file \'%s\'",fp);
      }
      fclose((FILE *)pos);
    }
  }
  return -1;
}

Assistant:

int32
logmath_write(logmath_t *lmath, const char *file_name)
{
    FILE *fp;
    long pos;
    uint32 chksum;

    if (lmath->t.table == NULL) {
        E_ERROR("No log table to write!\n");
        return -1;
    }

    E_INFO("Writing log table file '%s'\n", file_name);
    if ((fp = fopen(file_name, "wb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open logtable file '%s' for writing", file_name);
        return -1;
    }

    /* For whatever reason, we have to do this manually at the
     * moment. */
    fprintf(fp, "s3\nversion 1.0\nchksum0 yes\n");
    fprintf(fp, "width %d\n", lmath->t.width);
    fprintf(fp, "shift %d\n", lmath->t.shift);
    fprintf(fp, "logbase %f\n", lmath->base);
    /* Pad it out to ensure alignment. */
    pos = ftell(fp) + strlen("endhdr\n");
    if (pos & ((long)lmath->t.width - 1)) {
        size_t align = lmath->t.width - (pos & ((long)lmath->t.width - 1));
        assert(lmath->t.width <= 8);
        fwrite("        " /* 8 spaces */, 1, align, fp);
    }
    fprintf(fp, "endhdr\n");

    /* Now write the binary data. */
    chksum = (uint32)BYTE_ORDER_MAGIC;
    fwrite(&chksum, sizeof(uint32), 1, fp);
    chksum = 0;
    /* #Values to follow */
    if (bio_fwrite(&lmath->t.table_size, sizeof(uint32),
                   1, fp, 0, &chksum) != 1) {
        E_ERROR("Failed to write data to a file '%s'", file_name);
        goto error_out;
    }

    if ((uint32)bio_fwrite(lmath->t.table, lmath->t.width, lmath->t.table_size,
                   fp, 0, &chksum) != lmath->t.table_size) {
        E_ERROR("Failed to write data (%d x %d bytes) to the file '%s'",
                lmath->t.table_size, lmath->t.width, file_name);
        goto error_out;
    }
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, NULL) != 1) {
        E_ERROR("Failed to write checksum to the file '%s'", file_name);
        goto error_out;
    }

    fclose(fp);
    return 0;

error_out:
    fclose(fp);
    return -1;
}